

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O1

int __thiscall
FPCXTexture::CopyTrueColorPixels
          (FPCXTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  ushort uVar1;
  ushort uVar2;
  BYTE *dst;
  long lVar3;
  anon_union_4_2_12391d7c_for_PalEntry_0 *paVar4;
  uint uVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  BYTE b;
  BYTE g;
  BYTE r;
  BYTE c;
  uint local_518;
  uint local_514;
  FBitmap *local_510;
  BYTE *local_508;
  FCopyInfo *local_500;
  ulong local_4f8;
  FWadLump lump;
  PCXHeader header;
  PalEntry pe [256];
  
  uVar7 = (ulong)(uint)rotate;
  local_518 = x;
  local_510 = bmp;
  FWadCollection::OpenLumpNum(&lump,&Wads,(this->super_FTexture).SourceLump);
  FWadLump::Read(&lump,&header,0x80);
  uVar5 = (uint)header.numColorPlanes * (uint)header.bitsPerPixel;
  uVar1 = (this->super_FTexture).Width;
  uVar2 = (this->super_FTexture).Height;
  if (uVar5 < 0x18) {
    dst = (BYTE *)operator_new__((ulong)uVar2 * (ulong)uVar1);
    paVar4 = &pe[0].field_0;
    if (uVar5 < 8) {
      lVar3 = 0x12;
      do {
        *paVar4 = (anon_union_4_2_12391d7c_for_PalEntry_0)
                  ((uint)header.palette[lVar3 + -0x11] << 8 |
                   (uint)header.palette[lVar3 + -0x12] << 0x10 | (uint)header.palette[lVar3 + -0x10]
                  );
        lVar3 = lVar3 + 3;
        paVar4 = paVar4 + 1;
      } while (lVar3 != 0x42);
      if (uVar5 == 4) {
        ReadPCX4bits(this,dst,&lump.super_FileReader,&header);
      }
      else {
        ReadPCX1bit(this,dst,&lump.super_FileReader,&header);
      }
    }
    else if (uVar5 == 8) {
      local_514 = y;
      local_500 = inf;
      local_4f8 = uVar7;
      FWadLump::Seek(&lump,-0x301,2);
      (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&c,1);
      c = '\f';
      lVar3 = 0;
      local_508 = dst;
      do {
        (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&r,1);
        (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&g,1);
        (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&b,1);
        pe[lVar3].field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)
             ((uint)g << 8 | (uint)r << 0x10 | (uint)b | 0xff000000);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x100);
      FWadLump::Seek(&lump,0x80,0);
      dst = local_508;
      ReadPCX8bits(this,local_508,&lump.super_FileReader,&header);
      inf = local_500;
      uVar7 = local_4f8;
      y = local_514;
    }
    uVar6 = (ulong)(this->super_FTexture).Width;
    (*local_510->_vptr_FBitmap[3])
              (local_510,(ulong)local_518,(ulong)(uint)y,dst,uVar6,
               (ulong)(this->super_FTexture).Height,1,uVar6,uVar7,pe,inf);
  }
  else {
    dst = (BYTE *)operator_new__((ulong)((uint)uVar2 * (uint)uVar1 * 3));
    ReadPCX24bits(this,dst,&lump.super_FileReader,&header,3);
    uVar1 = (this->super_FTexture).Width;
    (*local_510->_vptr_FBitmap[2])
              (local_510,(ulong)local_518,(ulong)(uint)y,dst,(ulong)uVar1,
               (ulong)(this->super_FTexture).Height,3,(ulong)((uint)uVar1 + (uint)uVar1 * 2),uVar7,0
               ,inf,0,0,0);
  }
  operator_delete__(dst);
  FWadLump::~FWadLump(&lump);
  return 0;
}

Assistant:

int FPCXTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	PalEntry pe[256];
	PCXHeader header;
	int bitcount;
	BYTE * Pixels;

	FWadLump lump = Wads.OpenLumpNum(SourceLump);

	lump.Read(&header, sizeof(header));

	bitcount = header.bitsPerPixel * header.numColorPlanes;

	if (bitcount < 24)
	{
		Pixels = new BYTE[Width*Height];
		if (bitcount < 8)
		{
			for (int i=0;i<16;i++)
			{
				pe[i] = PalEntry(header.palette[i*3],header.palette[i*3+1],header.palette[i*3+2]);
			}

			switch (bitcount)
			{
			default:
			case 1:
				ReadPCX1bit (Pixels, lump, &header);
				break;

			case 4:
				ReadPCX4bits (Pixels, lump, &header);
				break;
			}
		}
		else if (bitcount == 8)
		{
			BYTE c;
			lump.Seek(-769, SEEK_END);
			lump >> c;
			c=0x0c;	// Apparently there's many non-compliant PCXs out there...
			if (c !=0x0c) 
			{
				for(int i=0;i<256;i++) pe[i]=PalEntry(255,i,i,i);	// default to a gray map
			}
			else for(int i=0;i<256;i++)
			{
				BYTE r,g,b;
				lump >> r >> g >> b;
				pe[i] = PalEntry(255, r,g,b);
			}
			lump.Seek(sizeof(header), SEEK_SET);
			ReadPCX8bits (Pixels, lump, &header);
		}
		bmp->CopyPixelData(x, y, Pixels, Width, Height, 1, Width, rotate, pe, inf);
	}
	else
	{
		Pixels = new BYTE[Width*Height * 3];
		ReadPCX24bits (Pixels, lump, &header, 3);
		bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 3, Width*3, rotate, CF_RGB, inf);
	}
	delete [] Pixels;
	return 0;
}